

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzfmt.cpp
# Opt level: O1

int32_t __thiscall
icu_63::TimeZoneFormat::parseOffsetLocalizedGMT
          (TimeZoneFormat *this,UnicodeString *text,ParsePosition *pos,UBool isShort,
          UBool *hasDigitOffset)

{
  ushort uVar1;
  short sVar2;
  int start;
  byte bVar3;
  int8_t iVar4;
  int32_t iVar5;
  int iVar6;
  char16_t *srcChars;
  int srcStart;
  int srcLength;
  long lVar7;
  int32_t parsedLength;
  int32_t local_34;
  
  start = pos->index;
  local_34 = 0;
  if (hasDigitOffset != (UBool *)0x0) {
    *hasDigitOffset = '\0';
  }
  iVar5 = parseOffsetLocalizedGMTPattern(this,text,start,'\0',&local_34);
  if ((local_34 < 1) &&
     (iVar5 = parseOffsetDefaultLocalizedGMT(this,text,start,&local_34), local_34 < 1)) {
    uVar1 = (this->fGMTZeroFormat).fUnion.fStackFields.fLengthAndFlags;
    if ((uVar1 & 1) == 0) {
      if ((short)uVar1 < 0) {
        iVar6 = (this->fGMTZeroFormat).fUnion.fFields.fLength;
      }
      else {
        iVar6 = (int)(short)uVar1 >> 5;
      }
      srcStart = 0;
      if (iVar6 < 0) {
        srcStart = iVar6;
      }
      srcLength = iVar6 - srcStart;
      if (iVar6 <= iVar6 - srcStart) {
        srcLength = iVar6;
      }
      if (iVar6 < 0) {
        srcLength = 0;
      }
      if ((uVar1 & 2) == 0) {
        srcChars = (this->fGMTZeroFormat).fUnion.fFields.fArray;
      }
      else {
        srcChars = (this->fGMTZeroFormat).fUnion.fStackFields.fBuffer;
      }
      bVar3 = UnicodeString::doCaseCompare(text,start,iVar6,srcChars,srcStart,srcLength,0);
    }
    else {
      bVar3 = ~*(byte *)&text->fUnion & 1;
    }
    if (bVar3 == 0) {
      sVar2 = (this->fGMTZeroFormat).fUnion.fStackFields.fLengthAndFlags;
      if (sVar2 < 0) {
        iVar6 = (this->fGMTZeroFormat).fUnion.fFields.fLength;
      }
      else {
        iVar6 = (int)sVar2 >> 5;
      }
      pos->index = iVar6 + start;
    }
    else {
      lVar7 = 0;
      do {
        iVar5 = u_strlen_63((UChar *)(ALT_GMT_STRINGS + lVar7));
        iVar4 = UnicodeString::doCaseCompare
                          (text,start,iVar5,(UChar *)(ALT_GMT_STRINGS + lVar7),0,iVar5,0);
        if (iVar4 == '\0') {
          pos->index = iVar5 + start;
          return 0;
        }
        lVar7 = lVar7 + 8;
      } while (lVar7 != 0x18);
      pos->errorIndex = start;
    }
    return 0;
  }
  if (hasDigitOffset != (UBool *)0x0) {
    *hasDigitOffset = '\x01';
  }
  pos->index = local_34 + start;
  return iVar5;
}

Assistant:

int32_t
TimeZoneFormat::parseOffsetLocalizedGMT(const UnicodeString& text, ParsePosition& pos, UBool isShort, UBool* hasDigitOffset) const {
    int32_t start = pos.getIndex();
    int32_t offset = 0;
    int32_t parsedLength = 0;

    if (hasDigitOffset) {
        *hasDigitOffset = FALSE;
    }

    offset = parseOffsetLocalizedGMTPattern(text, start, isShort, parsedLength);

    // For now, parseOffsetLocalizedGMTPattern handles both long and short
    // formats, no matter isShort is true or false. This might be changed in future
    // when strict parsing is necessary, or different set of patterns are used for
    // short/long formats.
#if 0
    if (parsedLength == 0) {
        offset = parseOffsetLocalizedGMTPattern(text, start, !isShort, parsedLength);
    }
#endif

    if (parsedLength > 0) {
        if (hasDigitOffset) {
            *hasDigitOffset = TRUE;
        }
        pos.setIndex(start + parsedLength);
        return offset;
    }

    // Try the default patterns
    offset = parseOffsetDefaultLocalizedGMT(text, start, parsedLength);
    if (parsedLength > 0) {
        if (hasDigitOffset) {
            *hasDigitOffset = TRUE;
        }
        pos.setIndex(start + parsedLength);
        return offset;
    }

    // Check if this is a GMT zero format
    if (text.caseCompare(start, fGMTZeroFormat.length(), fGMTZeroFormat, 0) == 0) {
        pos.setIndex(start + fGMTZeroFormat.length());
        return 0;
    }

    // Check if this is a default GMT zero format
    for (int32_t i = 0; ALT_GMT_STRINGS[i][0] != 0; i++) {
        const UChar* defGMTZero = ALT_GMT_STRINGS[i];
        int32_t defGMTZeroLen = u_strlen(defGMTZero);
        if (text.caseCompare(start, defGMTZeroLen, defGMTZero, 0) == 0) {
            pos.setIndex(start + defGMTZeroLen);
            return 0;
        }
    }

    // Nothing matched
    pos.setErrorIndex(start);
    return 0;
}